

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

int AnalyzeEntropy(uint32_t *argb,int width,int height,int argb_stride,int use_palette,
                  int palette_size,int transform_bits,EntropyIx *min_entropy_ix,
                  int *red_and_blue_always_zero)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  long lVar5;
  ulong uVar6;
  int in_ECX;
  uint32_t in_EDX;
  uint32_t in_ESI;
  uint32_t *in_RDI;
  int in_R8D;
  int in_R9D;
  uint32_t in_stack_00000008;
  uint *in_stack_00000010;
  undefined4 *in_stack_00000018;
  uint32_t *blue_histo;
  uint32_t *red_histo;
  int j;
  int last_mode_to_analyze;
  int k;
  uint64_t entropy [6];
  uint64_t entropy_comp [13];
  uint32_t hash;
  uint32_t pix_diff;
  uint32_t pix;
  uint32_t pix_prev;
  uint32_t *curr_row;
  uint32_t *prev_row;
  int y;
  int x;
  int i;
  uint32_t *histo;
  size_t in_stack_fffffffffffffed0;
  uint64_t in_stack_fffffffffffffed8;
  uint32_t *in_stack_fffffffffffffee0;
  int local_104;
  uint local_fc;
  ulong local_f8 [6];
  uint64_t local_c8 [4];
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  uint32_t local_60;
  uint32_t local_5c;
  uint32_t local_58;
  uint32_t local_54;
  uint32_t *local_50;
  uint32_t *local_48;
  int local_3c;
  int local_38;
  int local_34;
  uint32_t *local_30;
  int local_24;
  int local_20;
  int local_1c;
  uint32_t local_18;
  uint32_t local_14;
  uint32_t *local_10;
  int local_4;
  
  if ((in_R8D == 0) || (0x10 < in_R9D)) {
    local_24 = in_R9D;
    local_20 = in_R8D;
    local_1c = in_ECX;
    local_18 = in_EDX;
    local_14 = in_ESI;
    local_10 = in_RDI;
    local_30 = (uint32_t *)WebPSafeCalloc(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    if (local_30 == (uint32_t *)0x0) {
      local_4 = 0;
    }
    else {
      local_48 = (uint32_t *)0x0;
      local_50 = local_10;
      local_54 = *local_10;
      for (local_3c = 0; local_3c < (int)local_18; local_3c = local_3c + 1) {
        for (local_38 = 0; local_38 < (int)local_14; local_38 = local_38 + 1) {
          local_58 = local_50[local_38];
          local_5c = VP8LSubPixels(local_58,local_54);
          local_54 = local_58;
          if ((local_5c != 0) && ((local_48 == (uint32_t *)0x0 || (local_58 != local_48[local_38])))
             ) {
            AddSingle(local_58,local_30,local_30 + 0x400,local_30 + 0x200,local_30 + 0x600);
            AddSingle(local_5c,local_30 + 0x100,local_30 + 0x500,local_30 + 0x300,local_30 + 0x700);
            AddSingleSubGreen(local_58,local_30 + 0x800,local_30 + 0xa00);
            AddSingleSubGreen(local_5c,local_30 + 0x900,local_30 + 0xb00);
            local_60 = HashPix(local_58);
            local_30[local_60 + 0xc00] = local_30[local_60 + 0xc00] + 1;
          }
        }
        local_48 = local_50;
        local_50 = local_50 + local_1c;
      }
      iVar1 = 3;
      if (local_20 != 0) {
        iVar1 = 4;
      }
      local_30[0x900] = local_30[0x900] + 1;
      local_30[0xb00] = local_30[0xb00] + 1;
      local_30[0x500] = local_30[0x500] + 1;
      local_30[0x300] = local_30[0x300] + 1;
      local_30[0x700] = local_30[0x700] + 1;
      local_30[0x100] = local_30[0x100] + 1;
      for (local_104 = 0; local_104 < 0xd; local_104 = local_104 + 1) {
        uVar4 = VP8LBitsEntropy(in_stack_fffffffffffffee0,(int)(in_stack_fffffffffffffed8 >> 0x20));
        local_c8[local_104] = uVar4;
      }
      local_f8[0] = local_c8[0] + local_a8 + local_c8[2] + local_98;
      local_f8[1] = local_c8[1] + local_a0 + local_c8[3] + local_90;
      local_f8[2] = local_c8[0] + local_88 + local_c8[2] + local_78;
      local_f8[3] = local_c8[1] + local_80 + local_c8[3] + local_70;
      local_f8[4] = local_68;
      uVar2 = VP8LSubSampleSize(local_14,in_stack_00000008);
      uVar3 = VP8LSubSampleSize(local_18,in_stack_00000008);
      lVar5 = (ulong)uVar2 * (ulong)uVar3;
      uVar2 = VP8LFastLog2(0);
      local_f8[1] = lVar5 * (ulong)uVar2 + local_f8[1];
      uVar2 = VP8LSubSampleSize(local_14,in_stack_00000008);
      uVar6 = (ulong)uVar2;
      uVar2 = VP8LSubSampleSize(local_18,in_stack_00000008);
      lVar5 = uVar6 * uVar2;
      uVar2 = VP8LFastLog2(0);
      local_f8[3] = lVar5 * (ulong)uVar2 + local_f8[3];
      local_f8[4] = (long)local_24 * 0x4000000 + local_f8[4];
      *in_stack_00000010 = 0;
      for (local_fc = 1; (int)local_fc <= iVar1; local_fc = local_fc + 1) {
        if (local_f8[(int)local_fc] < local_f8[*in_stack_00000010]) {
          *in_stack_00000010 = local_fc;
        }
      }
      *in_stack_00000018 = 1;
      for (local_34 = 1; local_34 < 0x100; local_34 = local_34 + 1) {
        if (local_30[(long)(int)((uint)AnalyzeEntropy::kHistoPairs[*in_stack_00000010][0] << 8) +
                     (long)local_34] != 0 ||
            local_30[(long)(int)((uint)AnalyzeEntropy::kHistoPairs[*in_stack_00000010][1] << 8) +
                     (long)local_34] != 0) {
          *in_stack_00000018 = 0;
          break;
        }
      }
      WebPSafeFree((void *)0x17d4c6);
      local_4 = 1;
    }
  }
  else {
    *in_stack_00000010 = 4;
    *in_stack_00000018 = 1;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int AnalyzeEntropy(const uint32_t* argb,
                          int width, int height, int argb_stride,
                          int use_palette,
                          int palette_size, int transform_bits,
                          EntropyIx* const min_entropy_ix,
                          int* const red_and_blue_always_zero) {
  // Allocate histogram set with cache_bits = 0.
  uint32_t* histo;

  if (use_palette && palette_size <= 16) {
    // In the case of small palettes, we pack 2, 4 or 8 pixels together. In
    // practice, small palettes are better than any other transform.
    *min_entropy_ix = kPalette;
    *red_and_blue_always_zero = 1;
    return 1;
  }
  histo = (uint32_t*)WebPSafeCalloc(kHistoTotal, sizeof(*histo) * 256);
  if (histo != NULL) {
    int i, x, y;
    const uint32_t* prev_row = NULL;
    const uint32_t* curr_row = argb;
    uint32_t pix_prev = argb[0];  // Skip the first pixel.
    for (y = 0; y < height; ++y) {
      for (x = 0; x < width; ++x) {
        const uint32_t pix = curr_row[x];
        const uint32_t pix_diff = VP8LSubPixels(pix, pix_prev);
        pix_prev = pix;
        if ((pix_diff == 0) || (prev_row != NULL && pix == prev_row[x])) {
          continue;
        }
        AddSingle(pix,
                  &histo[kHistoAlpha * 256],
                  &histo[kHistoRed * 256],
                  &histo[kHistoGreen * 256],
                  &histo[kHistoBlue * 256]);
        AddSingle(pix_diff,
                  &histo[kHistoAlphaPred * 256],
                  &histo[kHistoRedPred * 256],
                  &histo[kHistoGreenPred * 256],
                  &histo[kHistoBluePred * 256]);
        AddSingleSubGreen(pix,
                          &histo[kHistoRedSubGreen * 256],
                          &histo[kHistoBlueSubGreen * 256]);
        AddSingleSubGreen(pix_diff,
                          &histo[kHistoRedPredSubGreen * 256],
                          &histo[kHistoBluePredSubGreen * 256]);
        {
          // Approximate the palette by the entropy of the multiplicative hash.
          const uint32_t hash = HashPix(pix);
          ++histo[kHistoPalette * 256 + hash];
        }
      }
      prev_row = curr_row;
      curr_row += argb_stride;
    }
    {
      uint64_t entropy_comp[kHistoTotal];
      uint64_t entropy[kNumEntropyIx];
      int k;
      int last_mode_to_analyze = use_palette ? kPalette : kSpatialSubGreen;
      int j;
      // Let's add one zero to the predicted histograms. The zeros are removed
      // too efficiently by the pix_diff == 0 comparison, at least one of the
      // zeros is likely to exist.
      ++histo[kHistoRedPredSubGreen * 256];
      ++histo[kHistoBluePredSubGreen * 256];
      ++histo[kHistoRedPred * 256];
      ++histo[kHistoGreenPred * 256];
      ++histo[kHistoBluePred * 256];
      ++histo[kHistoAlphaPred * 256];

      for (j = 0; j < kHistoTotal; ++j) {
        entropy_comp[j] = VP8LBitsEntropy(&histo[j * 256], 256);
      }
      entropy[kDirect] = entropy_comp[kHistoAlpha] +
          entropy_comp[kHistoRed] +
          entropy_comp[kHistoGreen] +
          entropy_comp[kHistoBlue];
      entropy[kSpatial] = entropy_comp[kHistoAlphaPred] +
          entropy_comp[kHistoRedPred] +
          entropy_comp[kHistoGreenPred] +
          entropy_comp[kHistoBluePred];
      entropy[kSubGreen] = entropy_comp[kHistoAlpha] +
          entropy_comp[kHistoRedSubGreen] +
          entropy_comp[kHistoGreen] +
          entropy_comp[kHistoBlueSubGreen];
      entropy[kSpatialSubGreen] = entropy_comp[kHistoAlphaPred] +
          entropy_comp[kHistoRedPredSubGreen] +
          entropy_comp[kHistoGreenPred] +
          entropy_comp[kHistoBluePredSubGreen];
      entropy[kPalette] = entropy_comp[kHistoPalette];

      // When including transforms, there is an overhead in bits from
      // storing them. This overhead is small but matters for small images.
      // For spatial, there are 14 transformations.
      entropy[kSpatial] += (uint64_t)VP8LSubSampleSize(width, transform_bits) *
                           VP8LSubSampleSize(height, transform_bits) *
                           VP8LFastLog2(14);
      // For color transforms: 24 as only 3 channels are considered in a
      // ColorTransformElement.
      entropy[kSpatialSubGreen] +=
          (uint64_t)VP8LSubSampleSize(width, transform_bits) *
          VP8LSubSampleSize(height, transform_bits) * VP8LFastLog2(24);
      // For palettes, add the cost of storing the palette.
      // We empirically estimate the cost of a compressed entry as 8 bits.
      // The palette is differential-coded when compressed hence a much
      // lower cost than sizeof(uint32_t)*8.
      entropy[kPalette] += (palette_size * 8ull) << LOG_2_PRECISION_BITS;

      *min_entropy_ix = kDirect;
      for (k = kDirect + 1; k <= last_mode_to_analyze; ++k) {
        if (entropy[*min_entropy_ix] > entropy[k]) {
          *min_entropy_ix = (EntropyIx)k;
        }
      }
      assert((int)*min_entropy_ix <= last_mode_to_analyze);
      *red_and_blue_always_zero = 1;
      // Let's check if the histogram of the chosen entropy mode has
      // non-zero red and blue values. If all are zero, we can later skip
      // the cross color optimization.
      {
        static const uint8_t kHistoPairs[5][2] = {
          { kHistoRed, kHistoBlue },
          { kHistoRedPred, kHistoBluePred },
          { kHistoRedSubGreen, kHistoBlueSubGreen },
          { kHistoRedPredSubGreen, kHistoBluePredSubGreen },
          { kHistoRed, kHistoBlue }
        };
        const uint32_t* const red_histo =
            &histo[256 * kHistoPairs[*min_entropy_ix][0]];
        const uint32_t* const blue_histo =
            &histo[256 * kHistoPairs[*min_entropy_ix][1]];
        for (i = 1; i < 256; ++i) {
          if ((red_histo[i] | blue_histo[i]) != 0) {
            *red_and_blue_always_zero = 0;
            break;
          }
        }
      }
    }
    WebPSafeFree(histo);
    return 1;
  } else {
    return 0;
  }
}